

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ocs_test.cc
# Opt level: O0

int main(void)

{
  test_activate_instance();
  test_add_authentic_ip();
  test_create_instance();
  test_data_operate();
  test_deactivate_instance();
  test_delete_instance();
  test_describe_authentic_ip();
  test_describe_history_monitor_values();
  test_describe_instances();
  test_describe_monitor_items();
  test_describe_monitor_values();
  test_describe_regions();
  test_describe_security_ips();
  test_describe_zones();
  test_flush_instance();
  test_modify_instance_attribute();
  test_modify_instance_capacity();
  test_modify_security_ips();
  test_remove_authentic_ip();
  test_replace_authentic_ip();
  test_verify_password();
  return 0;
}

Assistant:

int main() {
  test_activate_instance();
  test_add_authentic_ip();
  test_create_instance();
  test_data_operate();
  test_deactivate_instance();
  test_delete_instance();
  test_describe_authentic_ip();
  test_describe_history_monitor_values();
  test_describe_instances();
  test_describe_monitor_items();
  test_describe_monitor_values();
  test_describe_regions();
  test_describe_security_ips();
  test_describe_zones();
  test_flush_instance();
  test_modify_instance_attribute();
  test_modify_instance_capacity();
  test_modify_security_ips();
  test_remove_authentic_ip();
  test_replace_authentic_ip();
  test_verify_password();
}